

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void __thiscall slang::SVInt::shrinkToFit(SVInt *this)

{
  bitwidth_t bVar1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_20;
  uint local_18;
  byte local_13;
  
  bVar1 = getMinRepresentedBits(this);
  if (bVar1 + (bVar1 == 0) != (this->super_SVIntStorage).bitWidth) {
    resize((SVInt *)&local_20,(bitwidth_t)this);
    operator=(this,(SVInt *)&local_20);
    if (((0x40 < local_18) || ((local_13 & 1) != 0)) && ((void *)local_20.val != (void *)0x0)) {
      operator_delete__(local_20.pVal);
    }
  }
  return;
}

Assistant:

void SVInt::shrinkToFit() {
    bitwidth_t minBits = getMinRepresentedBits();
    if (minBits == 0)
        minBits = 1;

    if (minBits != bitWidth)
        *this = resize(minBits);
}